

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  scanner local_140;
  undefined1 local_108 [8];
  analysis an;
  undefined1 local_58 [8];
  scanner tokens;
  FILE *fp;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    printf("[HINT] Usage: vcc {<option> <args>} <filename>.c\n");
    exit(1);
  }
  tokens._48_8_ = fopen(argv[1],"r");
  if ((FILE *)tokens._48_8_ == (FILE *)0x0) {
    perror(argv[1]);
    exit(1);
  }
  dh::scanner::scanner((scanner *)local_58);
  dh::scanner::scan((scanner *)local_58,(FILE *)tokens._48_8_);
  bVar1 = dh::scanner::isRight((scanner *)local_58);
  if (bVar1) {
    dh::scanner::scanner(&local_140,(scanner *)local_58);
    dh::analysis::analysis((analysis *)local_108,&local_140);
    dh::scanner::~scanner(&local_140);
    dh::analysis::initSynTree((analysis *)local_108);
    dh::analysis::printTree((analysis *)local_108);
    dh::analysis::genMidCode((analysis *)local_108);
    dh::analysis::printMidCode((analysis *)local_108);
    dh::analysis::genCode((analysis *)local_108);
    an.midcodes.super__Vector_base<dh::trival,_std::allocator<dh::trival>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    dh::analysis::~analysis((analysis *)local_108);
  }
  else {
    an.midcodes.super__Vector_base<dh::trival,_std::allocator<dh::trival>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  argv_local._4_4_ = (uint)!bVar1;
  dh::scanner::~scanner((scanner *)local_58);
  return argv_local._4_4_;
}

Assistant:

int main( int argc, char** argv)
{
	if( argc <= 1)
	{
		::std::printf("[HINT] Usage: vcc {<option> <args>} <filename>.c\n");
		::std::exit(1);
	}

	FILE* fp = ::std::fopen(argv[1],"r");
	if ( NULL == fp)
	{
		::std::perror(argv[1]);
		::std::exit(1);
	}

	::dh::scanner tokens;
	
	tokens.scan(fp);

	if ( !tokens.isRight())
	{
		return 1;
	}

#ifdef _DEBUG_
	tokens.debug();
#endif

	::dh::analysis an(tokens);
	an.initSynTree();
	an.printTree();
	an.genMidCode();
	an.printMidCode();
	an.genCode();

	////// test hash table
	/*
	dh::symNodePtr tmp_node(new dh::symTabElem);
	tmp_node->name = "f";
	::std::shared_ptr< dh::symTab > tab(new dh::symTab("f",1));
	tab->insert_elem(tmp_node);

	::std::cout << "[A0] " << tab->get_in_function() << ::std::endl;
	::std::cout << "[A] " << (tab->research_elem(tab->get_in_function()) == nullptr) << ::std::endl;

	::std::shared_ptr< dh::symTab > tab2(new dh::symTab("f",1));

	tab2->set_upper_tab(tab);

	::std::cout << "[A] " << (tab2->research_elem(tab->get_in_function()) == nullptr) << ::std::endl;
	::std::cout << "[B] " << (tab2->research_elem_global(tab->get_in_function()) == nullptr) << ::std::endl;
	*/
	return 0;
	
}